

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O1

bool __thiscall
cmQtAutoGenerators::MakeParentDirectory(cmQtAutoGenerators *this,char *logPrefix,string *filename)

{
  bool bVar1;
  string error;
  string dirName;
  undefined1 local_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  cmsys::SystemTools::GetFilenamePath((string *)&local_38,filename);
  if (local_38._8_8_ == 0) {
    bVar1 = true;
  }
  else {
    bVar1 = cmsys::SystemTools::MakeDirectory((string *)&local_38);
    if (!bVar1) {
      std::__cxx11::string::string((string *)local_58._M_local_buf,logPrefix,(allocator *)local_78);
      std::__cxx11::string::append(local_58._M_local_buf);
      cmQtAutoGeneratorCommon::Quoted((string *)local_78,filename);
      std::__cxx11::string::_M_append(local_58._M_local_buf,local_78._0_8_);
      if ((cmQtAutoGenerators *)local_78._0_8_ != (cmQtAutoGenerators *)(local_78 + 0x10)) {
        operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
      }
      LogError((cmQtAutoGenerators *)local_78._0_8_,(string *)&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_allocated_capacity != &local_48) {
        operator_delete((void *)local_58._M_allocated_capacity,local_48._M_allocated_capacity + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_allocated_capacity != &local_28) {
    operator_delete((void *)local_38._M_allocated_capacity,local_28._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenerators::MakeParentDirectory(const char* logPrefix,
                                             const std::string& filename) const
{
  bool success = true;
  const std::string dirName = cmSystemTools::GetFilenamePath(filename);
  if (!dirName.empty()) {
    success = cmsys::SystemTools::MakeDirectory(dirName);
    if (!success) {
      std::string error = logPrefix;
      error += ": Error: Parent directory creation failed for ";
      error += Quoted(filename);
      this->LogError(error);
    }
  }
  return success;
}